

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

xmlChar * xmlSchemaFormatItemForReport
                    (xmlChar **buf,xmlChar *itemDes,xmlSchemaBasicItemPtr item,xmlNodePtr itemNode)

{
  xmlSchemaTypeType type;
  uint uVar1;
  byte bVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  char *pcVar5;
  xmlSchemaBasicItemPtr pxVar6;
  xmlSchemaElementPtr elem;
  xmlChar *str;
  xmlChar *local_38;
  
  local_38 = (xmlChar *)0x0;
  if (*buf != (xmlChar *)0x0) {
    (*xmlFree)(*buf);
    *buf = (xmlChar *)0x0;
  }
  bVar2 = 1;
  if (itemDes == (xmlChar *)0x0) goto switchD_00193d3d_caseD_3;
  type = *(xmlSchemaTypeType *)itemDes;
  switch(type) {
  case XML_SCHEMA_TYPE_BASIC:
    uVar1 = *(uint *)(itemDes + 0x58);
    if ((uVar1 >> 8 & 1) == 0) {
      if ((uVar1 & 0x40) == 0) {
        pcVar5 = "union type \'xs:";
        if (-1 < (char)uVar1) {
          pcVar5 = "simple type \'xs:";
        }
      }
      else {
        pcVar5 = "list type \'xs:";
      }
    }
    else {
      pcVar5 = "atomic type \'xs:";
    }
    pxVar3 = xmlStrdup((xmlChar *)pcVar5);
LAB_001940e4:
    *buf = pxVar3;
    pxVar4 = *(xmlChar **)(itemDes + 0x10);
    goto LAB_001940ee;
  case XML_SCHEMA_TYPE_ANY:
  case XML_SCHEMA_TYPE_ANY_ATTRIBUTE:
    if (*(int *)(itemDes + 0x28) - 1U < 3) {
      pcVar5 = &DAT_001e1f74 + *(int *)(&DAT_001e1f74 + (ulong)(*(int *)(itemDes + 0x28) - 1U) * 4);
    }
    else {
      pcVar5 = "invalid process contents";
    }
    pxVar4 = xmlStrdup((xmlChar *)pcVar5);
    *buf = pxVar4;
    pcVar5 = " wildcard";
    goto LAB_00194100;
  case XML_SCHEMA_TYPE_FACET:
  case XML_SCHEMA_TYPE_SIMPLE_CONTENT:
  case XML_SCHEMA_TYPE_COMPLEX_CONTENT:
  case XML_SCHEMA_TYPE_UR:
  case XML_SCHEMA_TYPE_RESTRICTION:
  case XML_SCHEMA_TYPE_EXTENSION:
  case XML_SCHEMA_TYPE_LIST:
  case XML_SCHEMA_TYPE_UNION:
    goto switchD_00193d3d_caseD_3;
  case XML_SCHEMA_TYPE_SIMPLE:
    pxVar4 = "";
    if ((itemDes[0x58] & 8) == 0) {
      pxVar4 = "local ";
    }
    pxVar4 = xmlStrdup(pxVar4);
    *buf = pxVar4;
    uVar1 = *(uint *)(itemDes + 0x58);
    if ((uVar1 >> 8 & 1) == 0) {
      if ((uVar1 & 0x40) == 0) {
        pcVar5 = "union type";
        if (-1 < (char)uVar1) {
          pcVar5 = "simple type";
        }
      }
      else {
        pcVar5 = "list type";
      }
    }
    else {
      pcVar5 = "atomic type";
    }
    pxVar4 = xmlStrcat(pxVar4,(xmlChar *)pcVar5);
    *buf = pxVar4;
    if ((itemDes[0x58] & 8) != 0) {
      pxVar4 = *buf;
LAB_001940df:
      pxVar3 = xmlStrcat(pxVar4," \'");
      goto LAB_001940e4;
    }
    break;
  case XML_SCHEMA_TYPE_COMPLEX:
    pxVar4 = "";
    if ((itemDes[0x58] & 8) == 0) {
      pxVar4 = "local ";
    }
    pxVar4 = xmlStrdup(pxVar4);
    *buf = pxVar4;
    pxVar4 = xmlStrcat(pxVar4,"complex type");
    *buf = pxVar4;
    if ((itemDes[0x58] & 8) != 0) goto LAB_001940df;
    break;
  case XML_SCHEMA_TYPE_SEQUENCE:
  case XML_SCHEMA_TYPE_CHOICE:
  case XML_SCHEMA_TYPE_ALL:
  case XML_SCHEMA_TYPE_PARTICLE:
    pxVar4 = xmlSchemaItemTypeToStr(type);
    pxVar4 = xmlStrdup(pxVar4);
    goto LAB_00194105;
  case XML_SCHEMA_TYPE_ELEMENT:
    pxVar4 = xmlStrdup((xmlChar *)"element decl.");
    *buf = pxVar4;
    pxVar3 = xmlStrcat(pxVar4," \'");
    *buf = pxVar3;
    pxVar4 = xmlSchemaFormatQName
                       (&local_38,*(xmlChar **)(itemDes + 0x60),*(xmlChar **)(itemDes + 0x10));
    goto LAB_001940ee;
  case XML_SCHEMA_TYPE_ATTRIBUTE:
    pxVar4 = xmlStrdup((xmlChar *)"attribute decl.");
    *buf = pxVar4;
    pxVar4 = xmlStrcat(pxVar4," \'");
    *buf = pxVar4;
    pxVar3 = xmlSchemaFormatQName
                       (&local_38,*(xmlChar **)(itemDes + 0x70),*(xmlChar **)(itemDes + 0x10));
LAB_00193f19:
    pxVar4 = xmlStrcat(pxVar4,pxVar3);
    *buf = pxVar4;
    if (local_38 != (xmlChar *)0x0) {
      (*xmlFree)(local_38);
      local_38 = (xmlChar *)0x0;
    }
    pxVar4 = *buf;
    pcVar5 = "\'";
    goto LAB_00194100;
  case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
    xmlSchemaGetComponentDesignation(buf,itemDes);
    break;
  case XML_SCHEMA_TYPE_GROUP:
    pxVar4 = xmlStrdup((xmlChar *)"model group def.");
    *buf = pxVar4;
    pxVar4 = xmlStrcat(pxVar4," \'");
    *buf = pxVar4;
    pxVar3 = xmlSchemaGetComponentQName(&local_38,itemDes);
    pxVar4 = xmlStrcat(pxVar4,pxVar3);
    *buf = pxVar4;
    pxVar4 = xmlStrcat(pxVar4,"\'");
    *buf = pxVar4;
    if (local_38 != (xmlChar *)0x0) {
      (*xmlFree)(local_38);
      local_38 = (xmlChar *)0x0;
    }
    break;
  case XML_SCHEMA_TYPE_NOTATION:
    pxVar4 = xmlSchemaItemTypeToStr(type);
    pxVar4 = xmlStrdup(pxVar4);
    *buf = pxVar4;
    pxVar4 = xmlStrcat(pxVar4," \'");
    *buf = pxVar4;
    pxVar3 = xmlSchemaGetComponentQName(&local_38,itemDes);
    pxVar4 = xmlStrcat(pxVar4,pxVar3);
    *buf = pxVar4;
    pxVar4 = xmlStrcat(pxVar4,"\'");
    *buf = pxVar4;
    if (local_38 != (xmlChar *)0x0) {
      (*xmlFree)(local_38);
      local_38 = (xmlChar *)0x0;
    }
    goto switchD_00193d3d_caseD_3;
  case XML_SCHEMA_TYPE_IDC_UNIQUE:
    pcVar5 = "unique \'";
    goto LAB_0019405a;
  case XML_SCHEMA_TYPE_IDC_KEY:
    pcVar5 = "key \'";
    goto LAB_0019405a;
  case XML_SCHEMA_TYPE_IDC_KEYREF:
    pcVar5 = "keyRef \'";
LAB_0019405a:
    pxVar3 = xmlStrdup((xmlChar *)pcVar5);
    *buf = pxVar3;
    pxVar4 = *(xmlChar **)(itemDes + 0x20);
    goto LAB_001940ee;
  case XML_SCHEMA_TYPE_ATTRIBUTE_USE:
    pxVar4 = xmlStrdup((xmlChar *)"attribute use ");
    *buf = pxVar4;
    if (*(long *)(itemDes + 0x18) != 0) {
      pxVar4 = xmlStrcat(pxVar4,"\'");
      *buf = pxVar4;
      pxVar3 = xmlSchemaGetComponentQName(&local_38,*(void **)(itemDes + 0x18));
      goto LAB_00193f19;
    }
    pcVar5 = "(unknown)";
    goto LAB_00194100;
  default:
    if (0xb < type - XML_SCHEMA_FACET_MININCLUSIVE) goto switchD_00193d3d_caseD_3;
    pxVar3 = xmlStrdup((xmlChar *)"facet \'");
    *buf = pxVar3;
    pxVar4 = xmlSchemaFacetTypeToString(*(xmlSchemaTypeType *)itemDes);
LAB_001940ee:
    pxVar4 = xmlStrcat(pxVar3,pxVar4);
    *buf = pxVar4;
    pcVar5 = "\'";
LAB_00194100:
    pxVar4 = xmlStrcat(pxVar4,(xmlChar *)pcVar5);
LAB_00194105:
    *buf = pxVar4;
  }
  bVar2 = 0;
switchD_00193d3d_caseD_3:
  if (!(bool)(bVar2 ^ 1 | item == (xmlSchemaBasicItemPtr)0x0)) {
    pxVar6 = item;
    if (*(int *)&item->dummy == 2) {
      pxVar6 = (xmlSchemaBasicItemPtr)item[2].dummy;
    }
    pxVar4 = xmlStrdup((xmlChar *)"Element \'");
    *buf = pxVar4;
    if (pxVar6[4].dummy == (void *)0x0) {
      pxVar4 = xmlStrcat(pxVar4,*(xmlChar **)(pxVar6 + 1));
      *buf = pxVar4;
    }
    else {
      pxVar3 = xmlSchemaFormatQName
                         (&local_38,*(xmlChar **)((long)pxVar6[4].dummy + 0x10),
                          *(xmlChar **)(pxVar6 + 1));
      pxVar4 = xmlStrcat(pxVar4,pxVar3);
      *buf = pxVar4;
      if (local_38 != (xmlChar *)0x0) {
        (*xmlFree)(local_38);
        local_38 = (xmlChar *)0x0;
      }
    }
    pxVar4 = xmlStrcat(*buf,"\'");
    *buf = pxVar4;
  }
  if ((item != (xmlSchemaBasicItemPtr)0x0) && (*(int *)&item->dummy == 2)) {
    pxVar4 = xmlStrcat(*buf,(xmlChar *)", attribute \'");
    *buf = pxVar4;
    if (item[4].dummy == (void *)0x0) {
      pxVar4 = xmlStrcat(pxVar4,*(xmlChar **)(item + 1));
      *buf = pxVar4;
    }
    else {
      pxVar3 = xmlSchemaFormatQName
                         (&local_38,*(xmlChar **)((long)item[4].dummy + 0x10),
                          *(xmlChar **)(item + 1));
      pxVar4 = xmlStrcat(pxVar4,pxVar3);
      *buf = pxVar4;
      if (local_38 != (xmlChar *)0x0) {
        (*xmlFree)(local_38);
        local_38 = (xmlChar *)0x0;
      }
    }
    pxVar4 = xmlStrcat(*buf,"\'");
    *buf = pxVar4;
  }
  if (local_38 != (xmlChar *)0x0) {
    (*xmlFree)(local_38);
    local_38 = (xmlChar *)0x0;
  }
  pxVar4 = xmlEscapeFormatString(buf);
  return pxVar4;
}

Assistant:

static xmlChar*
xmlSchemaFormatItemForReport(xmlChar **buf,
		     const xmlChar *itemDes,
		     xmlSchemaBasicItemPtr item,
		     xmlNodePtr itemNode)
{
    xmlChar *str = NULL;
    int named = 1;

    if (*buf != NULL) {
	xmlFree(*buf);
	*buf = NULL;
    }

    if (itemDes != NULL) {
	*buf = xmlStrdup(itemDes);
    } else if (item != NULL) {
	switch (item->type) {
	case XML_SCHEMA_TYPE_BASIC: {
	    xmlSchemaTypePtr type = WXS_TYPE_CAST item;

	    if (WXS_IS_ATOMIC(type))
		*buf = xmlStrdup(BAD_CAST "atomic type 'xs:");
	    else if (WXS_IS_LIST(type))
		*buf = xmlStrdup(BAD_CAST "list type 'xs:");
	    else if (WXS_IS_UNION(type))
		*buf = xmlStrdup(BAD_CAST "union type 'xs:");
	    else
		*buf = xmlStrdup(BAD_CAST "simple type 'xs:");
	    *buf = xmlStrcat(*buf, type->name);
	    *buf = xmlStrcat(*buf, BAD_CAST "'");
	    }
	    break;
	case XML_SCHEMA_TYPE_SIMPLE: {
	    xmlSchemaTypePtr type = WXS_TYPE_CAST item;

	    if (type->flags & XML_SCHEMAS_TYPE_GLOBAL) {
		*buf = xmlStrdup(BAD_CAST"");
	    } else {
		*buf = xmlStrdup(BAD_CAST "local ");
	    }
	    if (WXS_IS_ATOMIC(type))
		*buf = xmlStrcat(*buf, BAD_CAST "atomic type");
	    else if (WXS_IS_LIST(type))
		*buf = xmlStrcat(*buf, BAD_CAST "list type");
	    else if (WXS_IS_UNION(type))
		*buf = xmlStrcat(*buf, BAD_CAST "union type");
	    else
		*buf = xmlStrcat(*buf, BAD_CAST "simple type");
	    if (type->flags & XML_SCHEMAS_TYPE_GLOBAL) {
		*buf = xmlStrcat(*buf, BAD_CAST " '");
		*buf = xmlStrcat(*buf, type->name);
		*buf = xmlStrcat(*buf, BAD_CAST "'");
	    }
	    }
	    break;
	case XML_SCHEMA_TYPE_COMPLEX: {
	    xmlSchemaTypePtr type = WXS_TYPE_CAST item;

	    if (type->flags & XML_SCHEMAS_TYPE_GLOBAL)
		*buf = xmlStrdup(BAD_CAST "");
	    else
		*buf = xmlStrdup(BAD_CAST "local ");
	    *buf = xmlStrcat(*buf, BAD_CAST "complex type");
	    if (type->flags & XML_SCHEMAS_TYPE_GLOBAL) {
		*buf = xmlStrcat(*buf, BAD_CAST " '");
		*buf = xmlStrcat(*buf, type->name);
		*buf = xmlStrcat(*buf, BAD_CAST "'");
	    }
	    }
	    break;
	case XML_SCHEMA_TYPE_ATTRIBUTE_USE: {
		xmlSchemaAttributeUsePtr ause;

		ause = WXS_ATTR_USE_CAST item;
		*buf = xmlStrdup(BAD_CAST "attribute use ");
		if (WXS_ATTRUSE_DECL(ause) != NULL) {
		    *buf = xmlStrcat(*buf, BAD_CAST "'");
		    *buf = xmlStrcat(*buf,
			xmlSchemaGetComponentQName(&str, WXS_ATTRUSE_DECL(ause)));
		    FREE_AND_NULL(str)
			*buf = xmlStrcat(*buf, BAD_CAST "'");
		} else {
		    *buf = xmlStrcat(*buf, BAD_CAST "(unknown)");
		}
	    }
	    break;
	case XML_SCHEMA_TYPE_ATTRIBUTE: {
		xmlSchemaAttributePtr attr;

		attr = (xmlSchemaAttributePtr) item;
		*buf = xmlStrdup(BAD_CAST "attribute decl.");
		*buf = xmlStrcat(*buf, BAD_CAST " '");
		*buf = xmlStrcat(*buf, xmlSchemaFormatQName(&str,
		    attr->targetNamespace, attr->name));
		FREE_AND_NULL(str)
		    *buf = xmlStrcat(*buf, BAD_CAST "'");
	    }
	    break;
	case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
	    xmlSchemaGetComponentDesignation(buf, item);
	    break;
	case XML_SCHEMA_TYPE_ELEMENT: {
		xmlSchemaElementPtr elem;

		elem = (xmlSchemaElementPtr) item;
		*buf = xmlStrdup(BAD_CAST "element decl.");
		*buf = xmlStrcat(*buf, BAD_CAST " '");
		*buf = xmlStrcat(*buf, xmlSchemaFormatQName(&str,
		    elem->targetNamespace, elem->name));
		*buf = xmlStrcat(*buf, BAD_CAST "'");
	    }
	    break;
	case XML_SCHEMA_TYPE_IDC_UNIQUE:
	case XML_SCHEMA_TYPE_IDC_KEY:
	case XML_SCHEMA_TYPE_IDC_KEYREF:
	    if (item->type == XML_SCHEMA_TYPE_IDC_UNIQUE)
		*buf = xmlStrdup(BAD_CAST "unique '");
	    else if (item->type == XML_SCHEMA_TYPE_IDC_KEY)
		*buf = xmlStrdup(BAD_CAST "key '");
	    else
		*buf = xmlStrdup(BAD_CAST "keyRef '");
	    *buf = xmlStrcat(*buf, ((xmlSchemaIDCPtr) item)->name);
	    *buf = xmlStrcat(*buf, BAD_CAST "'");
	    break;
	case XML_SCHEMA_TYPE_ANY:
	case XML_SCHEMA_TYPE_ANY_ATTRIBUTE:
	    *buf = xmlStrdup(xmlSchemaWildcardPCToString(
		    ((xmlSchemaWildcardPtr) item)->processContents));
	    *buf = xmlStrcat(*buf, BAD_CAST " wildcard");
	    break;
	case XML_SCHEMA_FACET_MININCLUSIVE:
	case XML_SCHEMA_FACET_MINEXCLUSIVE:
	case XML_SCHEMA_FACET_MAXINCLUSIVE:
	case XML_SCHEMA_FACET_MAXEXCLUSIVE:
	case XML_SCHEMA_FACET_TOTALDIGITS:
	case XML_SCHEMA_FACET_FRACTIONDIGITS:
	case XML_SCHEMA_FACET_PATTERN:
	case XML_SCHEMA_FACET_ENUMERATION:
	case XML_SCHEMA_FACET_WHITESPACE:
	case XML_SCHEMA_FACET_LENGTH:
	case XML_SCHEMA_FACET_MAXLENGTH:
	case XML_SCHEMA_FACET_MINLENGTH:
	    *buf = xmlStrdup(BAD_CAST "facet '");
	    *buf = xmlStrcat(*buf, xmlSchemaFacetTypeToString(item->type));
	    *buf = xmlStrcat(*buf, BAD_CAST "'");
	    break;
	case XML_SCHEMA_TYPE_GROUP: {
		*buf = xmlStrdup(BAD_CAST "model group def.");
		*buf = xmlStrcat(*buf, BAD_CAST " '");
		*buf = xmlStrcat(*buf, xmlSchemaGetComponentQName(&str, item));
		*buf = xmlStrcat(*buf, BAD_CAST "'");
		FREE_AND_NULL(str)
	    }
	    break;
	case XML_SCHEMA_TYPE_SEQUENCE:
	case XML_SCHEMA_TYPE_CHOICE:
	case XML_SCHEMA_TYPE_ALL:
	case XML_SCHEMA_TYPE_PARTICLE:
	    *buf = xmlStrdup(WXS_ITEM_TYPE_NAME(item));
	    break;
	case XML_SCHEMA_TYPE_NOTATION: {
		*buf = xmlStrdup(WXS_ITEM_TYPE_NAME(item));
		*buf = xmlStrcat(*buf, BAD_CAST " '");
		*buf = xmlStrcat(*buf, xmlSchemaGetComponentQName(&str, item));
		*buf = xmlStrcat(*buf, BAD_CAST "'");
		FREE_AND_NULL(str);
	    }
            /* Falls through. */
	default:
	    named = 0;
	}
    } else
	named = 0;

    if ((named == 0) && (itemNode != NULL)) {
	xmlNodePtr elem;

	if (itemNode->type == XML_ATTRIBUTE_NODE)
	    elem = itemNode->parent;
	else
	    elem = itemNode;
	*buf = xmlStrdup(BAD_CAST "Element '");
	if (elem->ns != NULL) {
	    *buf = xmlStrcat(*buf,
		xmlSchemaFormatQName(&str, elem->ns->href, elem->name));
	    FREE_AND_NULL(str)
	} else
	    *buf = xmlStrcat(*buf, elem->name);
	*buf = xmlStrcat(*buf, BAD_CAST "'");

    }
    if ((itemNode != NULL) && (itemNode->type == XML_ATTRIBUTE_NODE)) {
	*buf = xmlStrcat(*buf, BAD_CAST ", attribute '");
	if (itemNode->ns != NULL) {
	    *buf = xmlStrcat(*buf, xmlSchemaFormatQName(&str,
		itemNode->ns->href, itemNode->name));
	    FREE_AND_NULL(str)
	} else
	    *buf = xmlStrcat(*buf, itemNode->name);
	*buf = xmlStrcat(*buf, BAD_CAST "'");
    }
    FREE_AND_NULL(str)

    return (xmlEscapeFormatString(buf));
}